

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O1

BasicValue * __thiscall
cmm::CMMInterpreter::callUserFunction
          (BasicValue *__return_storage_ptr__,CMMInterpreter *this,FunctionDefinitionAST *Function,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args,VariableEnv *Env)

{
  VariableEnv *pVVar1;
  _func_int **pp_Var2;
  _Base_ptr p_Var3;
  ulong uVar4;
  bool bVar5;
  char cVar6;
  undefined8 *puVar7;
  long *plVar8;
  undefined8 extraout_RAX;
  ulong *puVar9;
  ulong uVar10;
  BlockAST *pBVar11;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char cVar14;
  _func_int **pp_Var15;
  _Base_ptr p_Var16;
  string *Msg;
  undefined8 uVar17;
  CMMInterpreter *pCVar18;
  _List_node_base *p_Var19;
  BlockAST *pBVar20;
  _List_node_base *p_Var21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  ExecutionResult Result;
  VariableEnv FuncEnv;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [24];
  _Base_ptr local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  BlockAST *local_178;
  VariableEnv *local_170;
  undefined1 local_168 [24];
  uint local_150;
  undefined4 uStack_14c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  char local_b8 [16];
  anon_union_8_3_6d9870f7_for_BasicValue_2 local_a8;
  element_type *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_90 [8];
  _Base_ptr local_88;
  undefined1 local_80 [8];
  _Base_ptr p_Stack_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  CMMInterpreter *local_58;
  undefined1 local_50 [32];
  
  if ((Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl._M_node.
      _M_size ==
      (Function->ParameterList).super__List_base<cmm::Parameter,_std::allocator<cmm::Parameter>_>.
      _M_impl._M_node._M_size) {
    local_90 = (undefined1  [8])&this->TopLevelEnv;
    if (Env != (VariableEnv *)0x0) {
      local_90 = (undefined1  [8])Env;
    }
    local_70 = (_Base_ptr)local_80;
    local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
    p_Stack_78 = (_Base_ptr)0x0;
    local_60 = (_Base_ptr)0x0;
    p_Var19 = (Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
              _M_node.super__List_node_base._M_next;
    local_68 = local_70;
    local_58 = this;
    if (p_Var19 != (_List_node_base *)Args) {
      p_Var21 = (_List_node_base *)&Function->ParameterList;
      do {
        p_Var21 = (((_List_base<cmm::Parameter,_std::allocator<cmm::Parameter>_> *)&p_Var21->_M_next
                   )->_M_impl)._M_node.super__List_node_base._M_next;
        if (*(int *)&p_Var21[3]._M_next != *(int *)&p_Var19[1]._M_next) {
          if ((*(int *)&p_Var21[3]._M_next == 2) && (*(int *)&p_Var19[1]._M_next == 1)) {
            p_Var19[3]._M_prev = (_List_node_base *)(double)*(int *)&p_Var19[3]._M_prev;
            *(undefined4 *)&p_Var19[1]._M_next = 2;
            goto LAB_0010bb6a;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_168 + 0x10),"in function `",&Function->Name);
          plVar8 = (long *)std::__cxx11::string::append(local_168 + 0x10);
          local_138._M_dataplus._M_p = (pointer)*plVar8;
          paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p == paVar22) {
            local_138.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
            local_138.field_2._8_8_ = plVar8[3];
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          }
          else {
            local_138.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
          }
          local_138._M_string_length = plVar8[1];
          *plVar8 = (long)paVar22;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_138,(ulong)p_Var21[1]._M_next);
          local_118._0_8_ = *plVar8;
          puVar9 = (ulong *)(plVar8 + 2);
          if ((ulong *)local_118._0_8_ == puVar9) {
            local_118._16_8_ = *puVar9;
            local_118._24_8_ = plVar8[3];
            local_118._0_8_ = local_118 + 0x10;
          }
          else {
            local_118._16_8_ = *puVar9;
          }
          local_118._8_8_ = plVar8[1];
          *plVar8 = (long)puVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append(local_118);
          local_178 = (BlockAST *)*plVar8;
          pBVar20 = (BlockAST *)(plVar8 + 2);
          if (local_178 == pBVar20) {
            local_168._0_8_ = (pBVar20->super_StatementAST).super_AST._vptr_AST;
            local_168._8_8_ = plVar8[3];
            local_178 = (BlockAST *)local_168;
          }
          else {
            local_168._0_8_ = (pBVar20->super_StatementAST).super_AST._vptr_AST;
          }
          local_170 = (VariableEnv *)plVar8[1];
          *plVar8 = (long)pBVar20;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          cvm::TypeToStr_abi_cxx11_
                    ((string *)local_f8,(cvm *)(ulong)*(uint *)&p_Var21[3]._M_next,
                     (BasicType)local_170);
          pp_Var2 = (_func_int **)((long)&local_170->OuterEnv + (long)(_Rep_type *)local_f8._8_8_);
          pp_Var15 = (_func_int **)0xf;
          if (local_178 != (BlockAST *)local_168) {
            pp_Var15 = (_func_int **)local_168._0_8_;
          }
          paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_f8 + 0x10);
          if (pp_Var15 < pp_Var2) {
            pp_Var15 = (_func_int **)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._0_8_ != paVar22) {
              pp_Var15 = (_func_int **)local_f8._16_8_;
            }
            if (pp_Var15 < pp_Var2) goto LAB_0010bed4;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,(ulong)local_178);
          }
          else {
LAB_0010bed4:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_178,local_f8._0_8_);
          }
          local_1a8._16_8_ = *puVar7;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._16_8_ == paVar13) {
            local_188._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_188._8_8_ = puVar7[3];
            local_1a8._16_8_ = &local_188;
          }
          else {
            local_188._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_190 = (_Base_ptr)puVar7[1];
          *puVar7 = paVar13;
          puVar7[1] = 0;
          paVar13->_M_local_buf[0] = '\0';
          puVar7 = (undefined8 *)std::__cxx11::string::append(local_1a8 + 0x10);
          local_1b8._0_8_ = *puVar7;
          pBVar20 = (BlockAST *)(puVar7 + 2);
          if ((BlockAST *)local_1b8._0_8_ == pBVar20) {
            local_1a8._0_8_ = (pBVar20->super_StatementAST).super_AST._vptr_AST;
            local_1a8._8_8_ = puVar7[3];
            local_1b8._0_8_ = (BlockAST *)local_1a8;
          }
          else {
            local_1a8._0_8_ = (pBVar20->super_StatementAST).super_AST._vptr_AST;
          }
          local_1b8._8_8_ = puVar7[1];
          *puVar7 = pBVar20;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          cvm::TypeToStr_abi_cxx11_
                    ((string *)local_50,(cvm *)(ulong)((BasicValue *)(p_Var19 + 1))->Type,
                     (BasicType)local_1b8._8_8_);
          p_Var3 = (_Base_ptr)
                   (&(((_Rep_type *)local_1b8._8_8_)->_M_impl).field_0x0 +
                   (long)&(((_Rep_type *)local_50._8_8_)->_M_impl).field_0x0);
          p_Var16 = (_Base_ptr)0xf;
          if ((BlockAST *)local_1b8._0_8_ != (BlockAST *)local_1a8) {
            p_Var16 = (_Base_ptr)local_1a8._0_8_;
          }
          pBVar20 = (BlockAST *)(local_50 + 0x10);
          if (p_Var16 < p_Var3) {
            p_Var16 = (_Base_ptr)0xf;
            if ((BlockAST *)local_50._0_8_ != pBVar20) {
              p_Var16 = (_Base_ptr)local_50._16_8_;
            }
            if (p_Var16 < p_Var3) goto LAB_0010c275;
            pCVar18 = (CMMInterpreter *)local_50;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)pCVar18,0,(char *)0x0,local_1b8._0_8_);
          }
          else {
LAB_0010c275:
            pCVar18 = (CMMInterpreter *)local_1b8;
            puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)pCVar18,local_50._0_8_);
          }
          local_d8._0_8_ = *puVar7;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._0_8_ == paVar13) {
            local_c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_c8._8_8_ = puVar7[3];
            local_d8._0_8_ = &local_c8;
          }
          else {
            local_c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_d8._8_8_ = puVar7[1];
          *puVar7 = paVar13;
          puVar7[1] = 0;
          paVar13->_M_local_buf[0] = '\0';
          Msg = (string *)local_d8;
          RuntimeError(pCVar18,Msg);
          cVar14 = (char)Msg;
LAB_0010c41e:
          cVar14 = cVar14 + -2;
          goto LAB_0010c425;
        }
LAB_0010bb6a:
        if (p_Var21[1]._M_prev != (_List_node_base *)0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cvm::BasicValue>,std::_Select1st<std::pair<std::__cxx11::string_const,cvm::BasicValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cvm::BasicValue>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,cvm::BasicValue&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cvm::BasicValue>,std::_Select1st<std::pair<std::__cxx11::string_const,cvm::BasicValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cvm::BasicValue>>>
                      *)&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var21 + 1),(BasicValue *)(p_Var19 + 1));
        }
        p_Var19 = (((_List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)
                   &p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var19 != (_List_node_base *)Args);
    }
    executeStatement((ExecutionResult *)local_d8,local_58,(VariableEnv *)local_90,
                     (Function->Statement)._M_t.
                     super___uniq_ptr_impl<cmm::StatementAST,_std::default_delete<cmm::StatementAST>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmm::StatementAST_*,_std::default_delete<cmm::StatementAST>_>
                     .super__Head_base<0UL,_cmm::StatementAST_*,_false>._M_head_impl);
    if ((local_d8._0_4_ != _S_black) || (local_d8._8_4_ == Function->Type)) {
      __return_storage_ptr__->Type = local_d8._8_4_;
      (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->StrVal).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->StrVal,local_c8._M_allocated_capacity,
                 (char *)(local_c8._8_8_ + local_c8._M_allocated_capacity));
      __return_storage_ptr__->field_2 = local_a8;
      (__return_storage_ptr__->ArrayPtr).
      super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_a0;
      (__return_storage_ptr__->ArrayPtr).
      super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_98._M_pi;
      if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
        }
      }
      if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
      }
      if ((char *)local_c8._M_allocated_capacity != local_b8) {
        operator_delete((void *)local_c8._M_allocated_capacity);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>_>
                   *)&local_88);
      return __return_storage_ptr__;
    }
    std::operator+(&local_138,"function `",&Function->Name);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
    pBVar20 = (BlockAST *)(local_118 + 0x10);
    local_118._0_8_ = *puVar7;
    puVar9 = puVar7 + 2;
    if ((ulong *)local_118._0_8_ == puVar9) {
      local_118._16_8_ = *puVar9;
      local_118._24_8_ = puVar7[3];
      local_118._0_8_ = pBVar20;
    }
    else {
      local_118._16_8_ = *puVar9;
    }
    local_118._8_8_ = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    cvm::TypeToStr_abi_cxx11_
              ((string *)(local_168 + 0x10),(cvm *)(ulong)Function->Type,(BasicType)local_118._8_8_)
    ;
    p_Var3 = (_Base_ptr)(CONCAT44(uStack_14c,local_150) + local_118._8_8_);
    p_Var16 = (_Base_ptr)0xf;
    if ((BlockAST *)local_118._0_8_ != pBVar20) {
      p_Var16 = (_Base_ptr)local_118._16_8_;
    }
    if (p_Var16 < p_Var3) {
      uVar17 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._16_8_ != &local_148) {
        uVar17 = local_148._M_allocated_capacity;
      }
      if ((ulong)uVar17 < p_Var3) goto LAB_0010c1d2;
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)(local_168 + 0x10),0,(char *)0x0,local_118._0_8_);
    }
    else {
LAB_0010c1d2:
      plVar8 = (long *)std::__cxx11::string::_M_append(local_118,local_168._16_8_);
    }
    local_178 = (BlockAST *)*plVar8;
    pBVar11 = (BlockAST *)(plVar8 + 2);
    if (local_178 == pBVar11) {
      local_168._0_8_ = (pBVar11->super_StatementAST).super_AST._vptr_AST;
      local_168._8_8_ = plVar8[3];
      local_178 = (BlockAST *)local_168;
    }
    else {
      local_168._0_8_ = (pBVar11->super_StatementAST).super_AST._vptr_AST;
    }
    local_170 = (VariableEnv *)plVar8[1];
    *plVar8 = (long)pBVar11;
    plVar8[1] = 0;
    *(undefined1 *)&(pBVar11->super_StatementAST).super_AST._vptr_AST = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
    paVar22 = &local_188;
    local_1a8._16_8_ = *puVar7;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._16_8_ == paVar13) {
      local_188._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_188._8_8_ = puVar7[3];
      local_1a8._16_8_ = paVar22;
    }
    else {
      local_188._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_190 = (_Base_ptr)puVar7[1];
    *puVar7 = paVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    cvm::TypeToStr_abi_cxx11_
              ((string *)local_f8,(cvm *)(local_d8._8_8_ & 0xffffffff),(BasicType)local_190);
    uVar4 = (long)&local_190->_M_color + (long)(_Rep_type *)local_f8._8_8_;
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._16_8_ != paVar22) {
      uVar17 = local_188._M_allocated_capacity;
    }
    if ((ulong)uVar17 < uVar4) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_f8 + 0x10)) {
        uVar10 = local_f8._16_8_;
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._16_8_;
      if (uVar4 <= uVar10) goto LAB_0010c613;
    }
    pCVar18 = (CMMInterpreter *)(local_1a8 + 0x10);
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)pCVar18,local_f8._0_8_);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   "Function `",&Function->Name);
    plVar8 = (long *)std::__cxx11::string::append((char *)local_118);
    local_178 = (BlockAST *)*plVar8;
    pBVar20 = (BlockAST *)(plVar8 + 2);
    if (local_178 == pBVar20) {
      local_168._0_8_ = (pBVar20->super_StatementAST).super_AST._vptr_AST;
      local_168._8_8_ = plVar8[3];
      local_178 = (BlockAST *)local_168;
    }
    else {
      local_168._0_8_ = (pBVar20->super_StatementAST).super_AST._vptr_AST;
    }
    local_170 = (VariableEnv *)plVar8[1];
    *plVar8 = (long)pBVar20;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    uVar4 = (Function->ParameterList).
            super__List_base<cmm::Parameter,_std::allocator<cmm::Parameter>_>._M_impl._M_node.
            _M_size;
    cVar14 = '\x01';
    if (9 < uVar4) {
      uVar10 = uVar4;
      cVar6 = '\x04';
      do {
        cVar14 = cVar6;
        if (uVar10 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0010c01b;
        }
        if (uVar10 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0010c01b;
        }
        if (uVar10 < 10000) goto LAB_0010c01b;
        bVar5 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar6 = cVar14 + '\x04';
      } while (bVar5);
      cVar14 = cVar14 + '\x01';
    }
LAB_0010c01b:
    paVar22 = &local_138.field_2;
    local_138._M_dataplus._M_p = (pointer)paVar22;
    std::__cxx11::string::_M_construct((ulong)&local_138,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_138._M_dataplus._M_p,(uint)local_138._M_string_length,uVar4);
    pp_Var2 = (_func_int **)((long)&local_170->OuterEnv + local_138._M_string_length);
    pp_Var15 = (_func_int **)0xf;
    if (local_178 != (BlockAST *)local_168) {
      pp_Var15 = (_func_int **)local_168._0_8_;
    }
    if (pp_Var15 < pp_Var2) {
      uVar17 = (_func_int **)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar22) {
        uVar17 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < pp_Var2) goto LAB_0010c095;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_178);
    }
    else {
LAB_0010c095:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_138._M_dataplus._M_p)
      ;
    }
    local_1a8._16_8_ = *puVar7;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._16_8_ == paVar13) {
      local_188._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_188._8_8_ = puVar7[3];
      local_1a8._16_8_ = &local_188;
    }
    else {
      local_188._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_190 = (_Base_ptr)puVar7[1];
    *puVar7 = paVar13;
    puVar7[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append(local_1a8 + 0x10);
    pBVar20 = (BlockAST *)local_1a8;
    local_1b8._0_8_ = *puVar7;
    pBVar11 = (BlockAST *)(puVar7 + 2);
    if ((BlockAST *)local_1b8._0_8_ == pBVar11) {
      local_1a8._0_8_ = (pBVar11->super_StatementAST).super_AST._vptr_AST;
      local_1a8._8_8_ = puVar7[3];
      local_1b8._0_8_ = pBVar20;
    }
    else {
      local_1a8._0_8_ = (pBVar11->super_StatementAST).super_AST._vptr_AST;
    }
    local_1b8._8_8_ = puVar7[1];
    *puVar7 = pBVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    Args = (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)
           (Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
           _M_node._M_size;
    cVar14 = '\x01';
    if ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)0x9 < Args) {
      plVar12 = Args;
      cVar6 = '\x04';
      do {
        cVar14 = cVar6;
        if (plVar12 < (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)0x64)
        goto LAB_0010c41e;
        if (plVar12 < (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)0x3e8) {
          cVar14 = cVar14 + -1;
          goto LAB_0010c425;
        }
        if (plVar12 < (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)0x2710)
        goto LAB_0010c425;
        bVar5 = (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)0x1869f < plVar12;
        plVar12 = (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)
                  ((ulong)plVar12 / 10000);
        cVar6 = cVar14 + '\x04';
      } while (bVar5);
      cVar14 = cVar14 + '\x01';
    }
LAB_0010c425:
    local_168._16_8_ = &local_148;
    std::__cxx11::string::_M_construct((ulong)(local_168 + 0x10),cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_168._16_8_,local_150,(unsigned_long)Args);
    p_Var3 = (_Base_ptr)
             (&(((_Rep_type *)local_1b8._8_8_)->_M_impl).field_0x0 + CONCAT44(uStack_14c,local_150))
    ;
    p_Var16 = (_Base_ptr)0xf;
    if ((BlockAST *)local_1b8._0_8_ != pBVar20) {
      p_Var16 = (_Base_ptr)local_1a8._0_8_;
    }
    if (p_Var16 < p_Var3) {
      uVar17 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._16_8_ != &local_148) {
        uVar17 = local_148._M_allocated_capacity;
      }
      if ((ulong)uVar17 < p_Var3) goto LAB_0010c490;
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)(local_168 + 0x10),0,(char *)0x0,local_1b8._0_8_);
    }
    else {
LAB_0010c490:
      plVar8 = (long *)std::__cxx11::string::_M_append(local_1b8,local_168._16_8_);
    }
    local_90 = (undefined1  [8])*plVar8;
    pVVar1 = (VariableEnv *)(plVar8 + 2);
    if (local_90 == (undefined1  [8])pVVar1) {
      local_80 = (undefined1  [8])pVVar1->OuterEnv;
      p_Stack_78 = (_Base_ptr)plVar8[3];
      local_90 = (undefined1  [8])local_80;
    }
    else {
      local_80 = (undefined1  [8])pVVar1->OuterEnv;
    }
    local_88 = (_Base_ptr)plVar8[1];
    *plVar8 = (long)pVVar1;
    plVar8[1] = 0;
    *(undefined1 *)&pVVar1->OuterEnv = 0;
    pCVar18 = (CMMInterpreter *)local_90;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)pCVar18);
    local_d8._0_8_ = *puVar7;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ == paVar13) {
      local_c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_c8._8_8_ = puVar7[3];
      local_d8._0_8_ = &local_c8;
    }
    else {
      local_c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_d8._8_8_ = puVar7[1];
    *puVar7 = paVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    RuntimeError(pCVar18,(string *)local_d8);
LAB_0010c613:
    pCVar18 = (CMMInterpreter *)local_f8;
    plVar8 = (long *)std::__cxx11::string::replace((ulong)pCVar18,0,(char *)0x0,(ulong)paVar13);
  }
  local_1b8._0_8_ = *plVar8;
  pBVar11 = (BlockAST *)(plVar8 + 2);
  if ((BlockAST *)local_1b8._0_8_ == pBVar11) {
    local_1a8._0_8_ = (pBVar11->super_StatementAST).super_AST._vptr_AST;
    local_1a8._8_8_ = plVar8[3];
    local_1b8._0_8_ = (BlockAST *)local_1a8;
  }
  else {
    local_1a8._0_8_ = (pBVar11->super_StatementAST).super_AST._vptr_AST;
  }
  local_1b8._8_8_ = plVar8[1];
  *plVar8 = (long)pBVar11;
  plVar8[1] = 0;
  *(undefined1 *)&(pBVar11->super_StatementAST).super_AST._vptr_AST = 0;
  RuntimeError(pCVar18,(string *)local_1b8);
  if ((BlockAST *)local_1b8._0_8_ != (BlockAST *)local_1a8) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._16_8_ != paVar22) {
    operator_delete((void *)local_1a8._16_8_);
  }
  if (local_178 != (BlockAST *)local_168) {
    operator_delete(local_178);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._16_8_ != &local_148) {
    operator_delete((void *)local_168._16_8_);
  }
  if ((BlockAST *)local_118._0_8_ != pBVar20) {
    operator_delete((void *)local_118._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  ExecutionResult::~ExecutionResult((ExecutionResult *)local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>_>
               *)&local_88);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

cvm::BasicValue
CMMInterpreter::callUserFunction(const FunctionDefinitionAST &Function,
                                 std::list<cvm::BasicValue> &Args,
                                 VariableEnv *Env) {
  if (Args.size() != Function.getParameterCount()) {
    RuntimeError("Function `" + Function.getName() + "' expects " +
        std::to_string(Function.getParameterCount()) + " parameter(s), " +
        std::to_string(Args.size()) + " argument(s) provided");
  }

  VariableEnv FuncEnv(Env ? Env : &TopLevelEnv);

  auto It = Function.getParameterList().cbegin();
  auto End = Function.getParameterList().cend();
  for (cvm::BasicValue &Arg : Args) {
    if (It->getType() != Arg.Type) {
      if (Arg.isInt() && It->getType() == cvm::DoubleType) {
        Arg.DoubleVal = Arg.IntVal;
        Arg.Type = cvm::DoubleType;
      } else {
        RuntimeError("in function `" + Function.getName() + "', parameter `" +
          It->getName() + "' has type " + cvm::TypeToStr(It->getType()) +
          ", but argument is " + cvm::TypeToStr(Arg.Type));
      }
    }

    if (!It->getName().empty()) // We allow empty parameter name.
      FuncEnv.VarMap.emplace(It->getName(), Arg);
    ++It;
  }

  ExecutionResult Result = executeStatement(&FuncEnv, Function.getStatement());
  if (Result.Kind == ExecutionResult::ReturnStatementResult &&
      Result.ReturnValue.Type != Function.getType()) {
    RuntimeError("function `" + Function.getName() + "' ought to return " +
        cvm::TypeToStr(Function.getType()) + ", but got " +
        cvm::TypeToStr(Result.ReturnValue.Type));
  }
  return Result.ReturnValue;
}